

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this,
          Descriptor *descriptor,Context *context)

{
  FieldDescriptor *field;
  ulong __n;
  long lVar1;
  RepeatedImmutableEnumFieldLiteGenerator *pRVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  Descriptor *pDVar7;
  RepeatedImmutableEnumFieldLiteGenerator *this_00;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *psVar8;
  int messageBitIndex;
  ulong uVar9;
  int builderBitIndex;
  long lVar10;
  long lVar11;
  
  this->descriptor_ = descriptor;
  lVar10 = (long)*(int *)(descriptor + 0x2c);
  __n = lVar10 * 8;
  uVar9 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar10 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar9);
  *plVar6 = lVar10;
  if (lVar10 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)(plVar6 + 1)
           ,0,__n);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *)(plVar6 + 1);
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar11 = 0;
    lVar10 = 0;
    messageBitIndex = 0;
    builderBitIndex = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x30);
      field = (FieldDescriptor *)(lVar1 + lVar11);
      if (*(int *)(lVar1 + 0x4c + lVar11) == 3) {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          RepeatedImmutableStringFieldLiteGenerator::RepeatedImmutableStringFieldLiteGenerator
                    ((RepeatedImmutableStringFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          RepeatedImmutableEnumFieldLiteGenerator::RepeatedImmutableEnumFieldLiteGenerator
                    (this_00,field,messageBitIndex,builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar7 = FieldDescriptor::message_type(field);
          if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x6b) == '\x01') {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x48);
            ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator
                      ((ImmutableMapFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else if ((((context->options_).enforce_lite == false) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
                  (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            RepeatedImmutableMessageFieldLiteGenerator::RepeatedImmutableMessageFieldLiteGenerator
                      ((RepeatedImmutableMessageFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            RepeatedImmutableLazyMessageFieldLiteGenerator::
            RepeatedImmutableLazyMessageFieldLiteGenerator
                      ((RepeatedImmutableLazyMessageFieldLiteGenerator *)this_00,field,
                       messageBitIndex,builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          RepeatedImmutablePrimitiveFieldLiteGenerator::RepeatedImmutablePrimitiveFieldLiteGenerator
                    ((RepeatedImmutablePrimitiveFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      else if (*(long *)(lVar1 + 0x60 + lVar11) == 0) {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutableStringFieldLiteGenerator::ImmutableStringFieldLiteGenerator
                    ((ImmutableStringFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutableEnumFieldLiteGenerator::ImmutableEnumFieldLiteGenerator
                    ((ImmutableEnumFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          if ((((context->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
             (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            ImmutableMessageFieldLiteGenerator::ImmutableMessageFieldLiteGenerator
                      ((ImmutableMessageFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            ImmutableLazyMessageFieldLiteGenerator::ImmutableLazyMessageFieldLiteGenerator
                      ((ImmutableLazyMessageFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutablePrimitiveFieldLiteGenerator::ImmutablePrimitiveFieldLiteGenerator
                    ((ImmutablePrimitiveFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      else {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutableStringOneofFieldLiteGenerator::ImmutableStringOneofFieldLiteGenerator
                    ((ImmutableStringOneofFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutableEnumOneofFieldLiteGenerator::ImmutableEnumOneofFieldLiteGenerator
                    ((ImmutableEnumOneofFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          if ((((context->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
             (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            ImmutableMessageOneofFieldLiteGenerator::ImmutableMessageOneofFieldLiteGenerator
                      ((ImmutableMessageOneofFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
            ImmutableLazyMessageOneofFieldLiteGenerator::ImmutableLazyMessageOneofFieldLiteGenerator
                      ((ImmutableLazyMessageOneofFieldLiteGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldLiteGenerator *)operator_new(0x58);
          ImmutablePrimitiveOneofFieldLiteGenerator::ImmutablePrimitiveOneofFieldLiteGenerator
                    ((ImmutablePrimitiveOneofFieldLiteGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
               ::operator[](&this->field_generators_,lVar10);
      pRVar2 = (RepeatedImmutableEnumFieldLiteGenerator *)psVar8->ptr_;
      if (pRVar2 != this_00) {
        if (pRVar2 != (RepeatedImmutableEnumFieldLiteGenerator *)0x0) {
          (*(pRVar2->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator[1])();
        }
        psVar8->ptr_ = &this_00->super_ImmutableFieldLiteGenerator;
      }
      iVar4 = (*(this_00->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator[2])
                        (this_00);
      iVar5 = (*(this_00->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator[3])
                        (this_00);
      messageBitIndex = messageBitIndex + iVar4;
      builderBitIndex = builderBitIndex + iVar5;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa8;
    } while (lVar10 < *(int *)(descriptor + 0x2c));
  }
  return;
}

Assistant:

FieldGeneratorMap<ImmutableFieldLiteGenerator>::FieldGeneratorMap(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      field_generators_(new google::protobuf::scoped_ptr<
          ImmutableFieldLiteGenerator>[descriptor->field_count()]) {
  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    ImmutableFieldLiteGenerator* generator = MakeImmutableLiteGenerator(
        descriptor->field(i), messageBitIndex, builderBitIndex, context);
    field_generators_[i].reset(generator);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
  }
}